

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsSimpleTextItem::paint
          (QGraphicsSimpleTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  QArrayDataPointer<QTextLayout::FormatRange> local_2a38;
  QPen p;
  QTextLayout local_2a18;
  QArrayDataPointer<char16_t> local_2a10;
  undefined1 local_29f8 [8];
  undefined1 *puStack_29f0;
  undefined1 *local_29e8;
  qreal qStack_29e0;
  QStackTextEngine engine;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractGraphicsShapeItem).super_QGraphicsItem.d_ptr.d;
  QPainter::setFont((QFont *)painter);
  local_2a10.d = (Data *)pQVar2[1].childrenBoundingRect.w;
  local_2a10.ptr = (char16_t *)pQVar2[1].childrenBoundingRect.h;
  local_2a10.size = (qsizetype)pQVar2[1].needsRepaint.xp;
  if (local_2a10.d != (Data *)0x0) {
    LOCK();
    ((local_2a10.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2a10.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::replace((QChar)(char16_t)&local_2a10,(QChar)0xa,0x2028);
  QStackTextEngine::QStackTextEngine
            (&engine,(QString *)&local_2a10,(QFont *)&pQVar2[1].needsRepaint.yp);
  _p = &DAT_aaaaaaaaaaaaaaaa;
  local_2a18.d = (QTextEngine *)&engine;
  QPen::QPen(&p);
  QPen::setBrush((QBrush *)&p);
  QPainter::setPen((QPen *)painter);
  iVar3 = QPen::style();
  if ((iVar3 == 0) && (*(int *)((long)pQVar2[1]._vptr_QGraphicsItemPrivate + 4) == 1)) {
    QPainter::setBrush((BrushStyle)painter);
  }
  else {
    local_29e8 = &DAT_aaaaaaaaaaaaaaaa;
    local_29f8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    puStack_29f0 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_29f0);
    local_29f8 = (undefined1  [8])((ulong)local_29f8 & 0xffffffff00000000);
    QTextLayout::text();
    local_29f8._4_4_ = (int)local_2a38.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2a38);
    QTextCharFormat::setTextOutline((QTextCharFormat *)&puStack_29f0,(QPen *)&pQVar2[1].extras);
    QList<QTextLayout::FormatRange>::QList
              ((QList<QTextLayout::FormatRange> *)&local_2a38,1,(parameter_type)local_29f8);
    QTextLayout::setFormats((QList_conflict *)&local_2a18);
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_2a38);
    QTextFormat::~QTextFormat((QTextFormat *)&puStack_29f0);
  }
  setupTextLayout((QRectF *)local_29f8,&local_2a18);
  local_2a38.size = 0;
  local_2a48 = 0;
  uStack_2a40 = 0;
  local_2a38.d = (Data *)0x0;
  local_2a38.ptr = (FormatRange *)0x0;
  local_29e8 = (undefined1 *)0x0;
  qStack_29e0 = 0.0;
  local_29f8 = (undefined1  [8])0x0;
  puStack_29f0 = (undefined1 *)0x0;
  QTextLayout::draw((QPainter *)&local_2a18,(QPointF *)painter,(QList_conflict *)&local_2a48,
                    (QRectF *)&local_2a38);
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_2a38);
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8100) != 0) {
    qt_graphicsItem_highlightSelected((QGraphicsItem *)this,painter,option);
  }
  QPen::~QPen(&p);
  QTextLayout::~QTextLayout(&local_2a18);
  QStackTextEngine::~QStackTextEngine(&engine);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSimpleTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option, QWidget *widget)
{
    Q_UNUSED(widget);
    Q_D(QGraphicsSimpleTextItem);

    painter->setFont(d->font);

    QString tmp = d->text;
    tmp.replace(u'\n', QChar::LineSeparator);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(tmp, d->font);
    QTextLayout layout(&engine);

    QPen p;
    p.setBrush(d->brush);
    painter->setPen(p);
    if (d->pen.style() == Qt::NoPen && d->brush.style() == Qt::SolidPattern) {
        painter->setBrush(Qt::NoBrush);
    } else {
        QTextLayout::FormatRange range;
        range.start = 0;
        range.length = layout.text().size();
        range.format.setTextOutline(d->pen);
        layout.setFormats(QList<QTextLayout::FormatRange>(1, range));
    }

    setupTextLayout(&layout);
    layout.draw(painter, QPointF(0, 0));

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}